

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_grow(mbedtls_mpi *X,size_t nblimbs)

{
  ulong n;
  mbedtls_mpi_uint *v;
  mbedtls_mpi_uint *__dest;
  int iVar1;
  
  iVar1 = -0x10;
  if (nblimbs < 0x2711) {
    n = X->n;
    if (n < nblimbs) {
      __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
      if (__dest == (mbedtls_mpi_uint *)0x0) {
        return -0x10;
      }
      v = X->p;
      if (v != (mbedtls_mpi_uint *)0x0) {
        memcpy(__dest,v,n * 8);
        mbedtls_mpi_zeroize(v,n);
        free(X->p);
      }
      X->n = nblimbs;
      X->p = __dest;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_grow( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;

    if( nblimbs > MBEDTLS_MPI_MAX_LIMBS )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->n < nblimbs )
    {
        if( ( p = (mbedtls_mpi_uint*)mbedtls_calloc( nblimbs, ciL ) ) == NULL )
            return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

        if( X->p != NULL )
        {
            memcpy( p, X->p, X->n * ciL );
            mbedtls_mpi_zeroize( X->p, X->n );
            mbedtls_free( X->p );
        }

        X->n = nblimbs;
        X->p = p;
    }

    return( 0 );
}